

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int fse(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined8 *puVar12;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype wr;
  sunrealtype wl;
  sunrealtype vr;
  sunrealtype vl;
  sunrealtype ur;
  sunrealtype ul;
  sunrealtype awconst;
  sunrealtype avconst;
  sunrealtype auconst;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype dx;
  sunrealtype aw;
  sunrealtype av;
  sunrealtype au;
  sunindextype N;
  UserData udata;
  undefined8 in_stack_ffffffffffffff48;
  int opt;
  long lVar13;
  char *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  int local_4;
  
  lVar9 = *in_RDX;
  dVar1 = (double)in_RDX[8];
  dVar2 = (double)in_RDX[9];
  dVar3 = (double)in_RDX[10];
  dVar4 = (double)in_RDX[1];
  lVar11 = N_VGetArrayPointer(in_RDI);
  opt = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar10 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,opt);
  if (iVar10 == 0) {
    puVar12 = (undefined8 *)N_VGetArrayPointer(in_RSI);
    iVar10 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,opt);
    if (iVar10 == 0) {
      N_VConst(in_RSI);
      for (lVar13 = 1; lVar13 < lVar9 + -1; lVar13 = lVar13 + 1) {
        dVar5 = *(double *)(lVar11 + 8 + (lVar13 + -1) * 0x18);
        dVar6 = *(double *)(lVar11 + 8 + (lVar13 + 1) * 0x18);
        dVar7 = *(double *)(lVar11 + 0x10 + (lVar13 + -1) * 0x18);
        dVar8 = *(double *)(lVar11 + 0x10 + (lVar13 + 1) * 0x18);
        puVar12[lVar13 * 3] =
             (*(double *)(lVar11 + (lVar13 + 1) * 0x18) - *(double *)(lVar11 + (lVar13 + -1) * 0x18)
             ) * ((-dVar1 / 2.0) / dVar4);
        puVar12[lVar13 * 3 + 1] = (dVar6 - dVar5) * ((-dVar2 / 2.0) / dVar4);
        puVar12[lVar13 * 3 + 2] = (dVar8 - dVar7) * ((-dVar3 / 2.0) / dVar4);
      }
      puVar12[2] = 0;
      puVar12[1] = 0;
      *puVar12 = 0;
      puVar12[(lVar9 + -1) * 3 + 2] = 0;
      puVar12[(lVar9 + -1) * 3 + 1] = 0;
      puVar12[(lVar9 + -1) * 3] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fse(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype au     = udata->au;
  sunrealtype av     = udata->av;
  sunrealtype aw     = udata->aw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype auconst, avconst, awconst, ul, ur, vl, vr, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  auconst = -au / SUN_RCONST(2.0) / dx;
  avconst = -av / SUN_RCONST(2.0) / dx;
  awconst = -aw / SUN_RCONST(2.0) / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ur - ul) * auconst;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vr - vl) * avconst;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wr - wl) * awconst;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}